

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

void __thiscall
Lib::
SkipList<Inferences::ALASCA::BinaryResolutionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LDComparator>
::~SkipList(SkipList<Inferences::ALASCA::BinaryResolutionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LDComparator>
            *this)

{
  Node *pNVar1;
  Lhs local_40;
  
  pNVar1 = this->_left;
  if (pNVar1->nodes[0] != (Node *)0x0) {
    do {
      pop(&local_40,this);
      pNVar1 = this->_left;
    } while (pNVar1->nodes[0] != (Node *)0x0);
  }
  operator_delete(pNVar1,0x10);
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }